

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void mp::internal::PrintSolution
               (double *values,int num_values,char *name_col,char *value_col,NameProvider *np)

{
  ulong uVar1;
  int i;
  size_t sVar2;
  size_t sVar3;
  StringRef SVar4;
  double local_78;
  unsigned_long local_70;
  char *value_col_local;
  char *name_col_local;
  StringRef local_58;
  double local_48;
  undefined8 uStack_40;
  
  if (num_values != 0 && values != (double *)0x0) {
    value_col_local = value_col;
    name_col_local = name_col;
    uVar1 = strlen(name_col);
    sVar2 = 0;
    sVar3 = (ulong)(uint)num_values;
    if (num_values < 1) {
      sVar3 = sVar2;
    }
    for (; sVar3 != sVar2; sVar2 = sVar2 + 1) {
      SVar4 = NameProvider::name(np,sVar2,0xffffffffffffffff);
      if (uVar1 <= SVar4.size_) {
        uVar1 = SVar4.size_;
      }
    }
    local_70 = uVar1 + 2;
    fmt::printf<unsigned_long,char_const*,char_const*>
              ((CStringRef)0x382e62,&local_70,&name_col_local,&value_col_local);
    for (sVar2 = 0; sVar3 != sVar2; sVar2 = sVar2 + 1) {
      local_48 = values[sVar2];
      uStack_40 = 0;
      local_58 = NameProvider::name(np,sVar2,0xffffffffffffffff);
      local_78 = (double)(~-(ulong)(local_48 == 0.0) & (ulong)local_48);
      fmt::printf<unsigned_long,fmt::BasicStringRef<char>,double>
                ((CStringRef)0x382e6b,&local_70,&local_58,&local_78);
    }
  }
  return;
}

Assistant:

void PrintSolution(const double *values, int num_values, const char *name_col,
                   const char *value_col, NameProvider &np) {
  if (!values || num_values == 0)
    return;
  std::size_t name_len = std::strlen(name_col);
  std::size_t name_field_width = name_len;
  for (int i = 0; i < num_values; ++i)
    name_field_width = std::max(name_field_width, np.name(i).size());
  name_field_width += 2;
  fmt::printf("\n%-*s%s\n", name_field_width, name_col, value_col);
  for (int i = 0; i < num_values; ++i) {
    double value = values[i];
    fmt::printf("%-*s%.17g\n", name_field_width, np.name(i), value ? value : 0);
  }
}